

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O2

void __thiscall GuillotineBinPack::MergeFreeList(GuillotineBinPack *this)

{
  TArray<Rect,_Rect> *this_00;
  Rect *pRVar1;
  Rect *pRVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Rect *pRVar6;
  bool bVar7;
  ulong uVar8;
  uint index;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  DisjointRectCollection test;
  
  test.rects.Array = (Rect *)0x0;
  test.rects.Most = 0;
  test.rects.Count = 0;
  this_00 = &this->freeRectangles;
  uVar10 = 0xffffffffffffffff;
  lVar11 = 0;
  while( true ) {
    uVar8 = (ulong)(this->freeRectangles).Count;
    uVar10 = uVar10 + 1;
    if (uVar8 <= uVar10) break;
    bVar7 = DisjointRectCollection::Add(&test,(Rect *)((long)&this_00->Array->x + lVar11));
    lVar11 = lVar11 + 0x10;
    if (!bVar7) {
      __assert_fail("test.Add(freeRectangles[i]) == true",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/GuillotineBinPack.cpp"
                    ,0x254,"void GuillotineBinPack::MergeFreeList()");
    }
  }
  uVar10 = 0;
  do {
    uVar12 = uVar10;
    if (uVar8 <= uVar12) {
      TArray<Rect,_Rect>::Clear(&test.rects);
      uVar10 = 0xffffffffffffffff;
      lVar11 = 0;
      do {
        uVar10 = uVar10 + 1;
        if ((this->freeRectangles).Count <= uVar10) {
          TArray<Rect,_Rect>::~TArray(&test.rects);
          return;
        }
        bVar7 = DisjointRectCollection::Add(&test,(Rect *)((long)&this_00->Array->x + lVar11));
        lVar11 = lVar11 + 0x10;
      } while (bVar7);
      __assert_fail("test.Add(freeRectangles[i]) == true",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/GuillotineBinPack.cpp"
                    ,0x281,"void GuillotineBinPack::MergeFreeList()");
    }
    uVar9 = uVar12 + 1 & 0xffffffff;
    while (index = (uint)uVar9, uVar10 = uVar12 + 1, index < (uint)uVar8) {
      pRVar6 = this_00->Array;
      pRVar1 = pRVar6 + uVar12;
      iVar3 = pRVar6[uVar12].width;
      pRVar2 = pRVar6 + uVar9;
      iVar4 = pRVar6[uVar9].width;
      if ((iVar3 == iVar4) && (pRVar1->x == pRVar2->x)) {
        iVar3 = pRVar1->y;
        iVar4 = pRVar2->height;
        if (iVar3 == iVar4 + pRVar2->y) {
          pRVar1->y = iVar3 - iVar4;
          pRVar1->height = pRVar1->height + iVar4;
        }
        else {
          if (iVar3 + pRVar1->height != pRVar2->y) goto LAB_00324aa0;
          pRVar1->height = pRVar1->height + iVar4;
        }
LAB_00324a94:
        TArray<Rect,_Rect>::Delete(this_00,index);
        index = index - 1;
      }
      else if ((pRVar1->height == pRVar2->height) && (pRVar1->y == pRVar2->y)) {
        iVar5 = pRVar1->x;
        if (iVar5 == pRVar2->x + iVar4) {
          pRVar1->x = iVar5 - iVar4;
          pRVar1->width = iVar3 + iVar4;
        }
        else {
          if (iVar5 + iVar3 != pRVar2->x) goto LAB_00324aa0;
          pRVar1->width = iVar4 + iVar3;
        }
        goto LAB_00324a94;
      }
LAB_00324aa0:
      uVar8 = (ulong)(this->freeRectangles).Count;
      uVar9 = (ulong)(index + 1);
    }
  } while( true );
}

Assistant:

void GuillotineBinPack::MergeFreeList()
{
#ifdef _DEBUG
	DisjointRectCollection test;
	for(unsigned i = 0; i < freeRectangles.Size(); ++i)
		assert(test.Add(freeRectangles[i]) == true);
#endif

	// Do a Theta(n^2) loop to see if any pair of free rectangles could me merged into one.
	// Note that we miss any opportunities to merge three rectangles into one. (should call this function again to detect that)
	for(unsigned i = 0; i < freeRectangles.Size(); ++i)
		for(unsigned j = i+1; j < freeRectangles.Size(); ++j)
		{
			if (freeRectangles[i].width == freeRectangles[j].width && freeRectangles[i].x == freeRectangles[j].x)
			{
				if (freeRectangles[i].y == freeRectangles[j].y + freeRectangles[j].height)
				{
					freeRectangles[i].y -= freeRectangles[j].height;
					freeRectangles[i].height += freeRectangles[j].height;
					freeRectangles.Delete(j);
					--j;
				}
				else if (freeRectangles[i].y + freeRectangles[i].height == freeRectangles[j].y)
				{
					freeRectangles[i].height += freeRectangles[j].height;
					freeRectangles.Delete(j);
					--j;
				}
			}
			else if (freeRectangles[i].height == freeRectangles[j].height && freeRectangles[i].y == freeRectangles[j].y)
			{
				if (freeRectangles[i].x == freeRectangles[j].x + freeRectangles[j].width)
				{
					freeRectangles[i].x -= freeRectangles[j].width;
					freeRectangles[i].width += freeRectangles[j].width;
					freeRectangles.Delete(j);
					--j;
				}
				else if (freeRectangles[i].x + freeRectangles[i].width == freeRectangles[j].x)
				{
					freeRectangles[i].width += freeRectangles[j].width;
					freeRectangles.Delete(j);
					--j;
				}
			}
		}

#ifdef _DEBUG
	test.Clear();
	for(unsigned i = 0; i < freeRectangles.Size(); ++i)
		assert(test.Add(freeRectangles[i]) == true);
#endif
}